

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

bool __thiscall
Parser::parseExpressionList
          (Parser *this,vector<Expression,_std::allocator<Expression>_> *list,int min,int max)

{
  Token *token;
  Token *pTVar1;
  ulong uVar2;
  int *args;
  char *text;
  size_type __n;
  bool bVar3;
  int max_local;
  int min_local;
  Expression exp;
  Expression local_48;
  
  max_local = max;
  min_local = min;
  std::vector<Expression,_std::allocator<Expression>_>::clear(list);
  __n = 0x20;
  if (-1 < max) {
    __n = (size_type)(uint)max;
  }
  std::vector<Expression,_std::allocator<Expression>_>::reserve(list,__n);
  token = peekToken(this,0);
  parseExpression(&exp,this);
  std::vector<Expression,_std::allocator<Expression>_>::push_back(list,&exp);
  bVar3 = exp.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0;
  if (!bVar3) {
    printError<>(this,token,"Parameter failure");
    Tokenizer::skipLookahead
              ((this->entries).
               super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].tokenizer);
  }
  while( true ) {
    pTVar1 = peekToken(this,0);
    if (pTVar1->type != Comma) break;
    eatToken(this);
    parseExpression(&local_48,this);
    Expression::operator=(&exp,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_48.expression.
                super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::vector<Expression,_std::allocator<Expression>_>::push_back(list,&exp);
    if (exp.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      printError<>(this,token,"Parameter failure");
      bVar3 = false;
      Tokenizer::skipLookahead
                ((this->entries).
                 super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
                 super__Vector_impl_data._M_finish[-1].tokenizer);
    }
  }
  uVar2 = ((long)(list->super__Vector_base<Expression,_std::allocator<Expression>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(list->super__Vector_base<Expression,_std::allocator<Expression>_>)._M_impl.
                super__Vector_impl_data._M_start) / 0x18;
  if (uVar2 < (ulong)(long)min) {
    args = &min_local;
    text = "Not enough parameters (min %d)";
  }
  else {
    if (uVar2 <= (ulong)(long)max) goto LAB_0013f46c;
    args = &max_local;
    text = "Too many parameters (max %d)";
  }
  printError<int>(this,token,text,args);
  bVar3 = false;
LAB_0013f46c:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&exp.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return bVar3;
}

Assistant:

bool Parser::parseExpressionList(std::vector<Expression>& list, int min, int max)
{
	bool valid = true;
	list.clear();
	list.reserve(max >= 0 ? max : 32);

	const Token& start = peekToken();

	Expression exp = parseExpression();
	list.push_back(exp);

	if (!exp.isLoaded())
	{
		printError(start, "Parameter failure");
		getTokenizer()->skipLookahead();
		valid = false;
	}

	while (peekToken().type == TokenType::Comma)
	{
		eatToken();

		exp = parseExpression();
		list.push_back(exp);

		if (!exp.isLoaded())
		{
			printError(start, "Parameter failure");
			getTokenizer()->skipLookahead();
			valid = false;
		}
	}

	if (list.size() < (size_t) min)
	{
		printError(start, "Not enough parameters (min %d)",min);
		return false;
	}

	if (max != -1 && (size_t) max < list.size())
	{
		printError(start, "Too many parameters (max %d)",max);
		return false;
	}

	return valid;
}